

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

uint64_t __thiscall
fmp4_stream::ingest_stream::get_media_segment_data
          (ingest_stream *this,size_t index,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *media_seg_dat)

{
  pointer pmVar1;
  void *pvVar2;
  long lVar3;
  pointer peVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  uint64_t __new_size;
  long lVar8;
  long lVar9;
  
  pmVar1 = (this->media_fragment_).
           super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(this->media_fragment_).
                 super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar1 >> 3) *
          0x1cac083126e978d5;
  if (uVar5 < index || uVar5 - index == 0) {
    __new_size = 0;
  }
  else {
    __new_size = pmVar1[index].mdat_box_.large_size_ + pmVar1[index].moof_box_.large_size_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(media_seg_dat,__new_size);
    pmVar1 = (this->media_fragment_).
             super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar4 = *(pointer *)
              &pmVar1[index].emsg_.
               super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>._M_impl;
    if (*(pointer *)
         ((long)&pmVar1[index].emsg_.
                 super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>._M_impl +
         8) == peVar4) {
      lVar9 = 0;
    }
    else {
      lVar8 = 0;
      uVar5 = 0;
      lVar9 = 0;
      do {
        pvVar2 = *(void **)((long)(peVar4->super_full_box).super_box.extended_type_ + lVar8 + 0x10U)
        ;
        sVar6 = *(long *)((long)(peVar4->super_full_box).super_box.extended_type_ + lVar8 + 0x18U) -
                (long)pvVar2;
        if (sVar6 != 0) {
          memmove((media_seg_dat->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                  ._M_impl.super__Vector_impl_data._M_start,pvVar2,sVar6);
        }
        lVar3 = *(long *)&(this->media_fragment_).
                          super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
                          ._M_impl.super__Vector_impl_data._M_start[index].emsg_.
                          super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>.
                          _M_impl;
        lVar3 = (*(code *)**(undefined8 **)(lVar3 + lVar8))(lVar3 + lVar8);
        lVar9 = lVar9 + lVar3;
        uVar5 = uVar5 + 1;
        pmVar1 = (this->media_fragment_).
                 super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        peVar4 = *(pointer *)
                  &pmVar1[index].emsg_.
                   super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>._M_impl
        ;
        uVar7 = ((long)*(pointer *)
                        ((long)&pmVar1[index].emsg_.
                                super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>
                                ._M_impl + 8) - (long)peVar4 >> 5) * 0x6db6db6db6db6db7;
        lVar8 = lVar8 + 0xe0;
      } while (uVar5 <= uVar7 && uVar7 - uVar5 != 0);
    }
    pvVar2 = pmVar1[index].moof_box_.box_data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = (long)*(pointer *)
                   ((long)&pmVar1[index].moof_box_.box_data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 8) -
            (long)pvVar2;
    if (sVar6 != 0) {
      memmove((media_seg_dat->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
              _M_impl.super__Vector_impl_data._M_start + lVar9,pvVar2,sVar6);
    }
    pmVar1 = (this->media_fragment_).
             super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = *(void **)&pmVar1[index].mdat_box_.box_data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
    sVar6 = (long)*(pointer *)
                   ((long)&pmVar1[index].mdat_box_.box_data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 8) -
            (long)pvVar2;
    if (sVar6 != 0) {
      memmove((media_seg_dat->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
              _M_impl.super__Vector_impl_data._M_start + lVar9 + pmVar1[index].moof_box_.large_size_
              ,pvVar2,sVar6);
    }
  }
  return __new_size;
}

Assistant:

uint64_t ingest_stream::get_media_segment_data(
		std::size_t index, std::vector<uint8_t> &media_seg_dat)
	{
		if (!(media_fragment_.size() > index))
			return 0;

		uint64_t ssize = media_fragment_[index].moof_box_.large_size_ + media_fragment_[index].mdat_box_.large_size_;
		media_seg_dat.resize(ssize);

		// copy emsgs
		size_t ptr_of = 0;
		for (int k = 0; k < media_fragment_[index].emsg_.size(); k++)
		{
			std::copy(media_fragment_[index].emsg_[k].box_data_.begin(),
				media_fragment_[index].emsg_[k].box_data_.end(),
				media_seg_dat.begin());
			ptr_of += media_fragment_[index].emsg_[k].size();
		}

		// copy moviefragmentbox
		std::copy(media_fragment_[index].moof_box_.box_data_.begin(), 
			      media_fragment_[index].moof_box_.box_data_.end(), 
			      media_seg_dat.begin() + ptr_of
	    );
		// copy mdat
		std::copy(media_fragment_[index].mdat_box_.box_data_.begin(), 
			      media_fragment_[index].mdat_box_.box_data_.end(), 
			      media_seg_dat.begin() + media_fragment_[index].moof_box_.large_size_ + ptr_of
	    );

		return ssize;
	}